

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::BindingUniformBlocksTest::prepareShaderSource
          (BindingUniformBlocksTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  pointer psVar1;
  TestError *this_00;
  char *pcVar2;
  char *pcVar3;
  size_t position;
  size_t local_38;
  
  if (in_stage < SHADER_STAGES_MAX) {
    pcVar2 = (&PTR_anon_var_dwarf_5ba228_020dcda8)[in_stage];
    psVar1 = (out_source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (char *)(psVar1->m_code)._M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)pcVar2);
    local_38 = 0;
    pcVar2 = "#version 420";
    if (in_use_version_400) {
      pcVar2 = 
      "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
      ;
    }
    pcVar3 = "#version 430";
    if (in_stage != COMPUTE_SHADER) {
      pcVar3 = pcVar2;
    }
    Utils::replaceToken("VERSION",&local_38,pcVar3,
                        &((out_source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceToken("VERIFICATION",&local_38,
                        "    if ((vec4(1, 0, 0, 0) != goku.chichi)    ||\n        (vec3(0, 1, 0)    != vegeta.bulma)   ||\n        (vec4(0, 0, 1, 0) != children.gohan) ||\n        (vec4(0, 0, 0, 1) != children.trunks) )\n    {\n        result = vec4(1, 0, 0, 1);\n    }\n"
                        ,&((out_source->m_parts).
                           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceAllTokens
              ("UNI_GOKU","layout(std140, binding = 0) uniform GOKU {\n    vec4 chichi;\n} goku;\n",
               &((out_source->m_parts).
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceAllTokens
              ("UNI_VEGETA",
               "layout(std140, binding = 1) uniform VEGETA {\n    vec3 bulma;\n} vegeta;\n",
               &((out_source->m_parts).
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceAllTokens
              ("UNI_CHILDREN",
               "layout(std140, binding = 3) uniform CHILDREN {\n    vec4 gohan;\n    vec4 trunks;\n} children;\n\n"
               ,&((out_source->m_parts).
                  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_code);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x1fe8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BindingUniformBlocksTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
												   Utils::shaderSource& out_source)
{
	static const GLchar* uni_goku = "layout(std140, binding = 0) uniform GOKU {\n"
									"    vec4 chichi;\n"
									"} goku;\n";

	static const GLchar* uni_vegeta = "layout(std140, binding = 1) uniform VEGETA {\n"
									  "    vec3 bulma;\n"
									  "} vegeta;\n";

	static const GLchar* uni_children = "layout(std140, binding = 3) uniform CHILDREN {\n"
										"    vec4 gohan;\n"
										"    vec4 trunks;\n"
										"} children;\n\n";

	static const GLchar* verification_snippet = "    if ((vec4(1, 0, 0, 0) != goku.chichi)    ||\n"
												"        (vec3(0, 1, 0)    != vegeta.bulma)   ||\n"
												"        (vec4(0, 0, 1, 0) != children.gohan) ||\n"
												"        (vec4(0, 0, 0, 1) != children.trunks) )\n"
												"    {\n"
												"        result = vec4(1, 0, 0, 1);\n"
												"    }\n";

	static const GLchar* compute_shader_template =
		"VERSION\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D uni_image;\n"
		"\n"
		"UNI_GOKU\n"
		"UNI_VEGETA\n"
		"UNI_CHILDREN\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"\n"
													"UNI_GOKU\n"
													"UNI_VEGETA\n"
													"UNI_CHILDREN\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"\n"
													"UNI_CHILDREN\n"
													"UNI_GOKU\n"
													"UNI_VEGETA\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"UNI_VEGETA\n"
		"UNI_CHILDREN\n"
		"UNI_GOKU\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "\n"
													 "UNI_GOKU\n"
													 "UNI_CHILDREN\n"
													 "UNI_VEGETA\n"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "UNI_CHILDREN\n"
												  "UNI_VEGETA\n"
												  "UNI_GOKU\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const GLchar* shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;

	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("UNI_GOKU", uni_goku, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("UNI_VEGETA", uni_vegeta, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("UNI_CHILDREN", uni_children, out_source.m_parts[0].m_code);
}